

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.hpp
# Opt level: O2

void __thiscall
duckdb::WindowExecutorBoundsState::~WindowExecutorBoundsState(WindowExecutorBoundsState *this)

{
  ~WindowExecutorBoundsState(this);
  operator_delete(this);
  return;
}

Assistant:

~WindowExecutorBoundsState() override {
	}